

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

_class * class_new(t_symbol *s,t_newmethod newmethod,t_method freemethod,size_t size,int flags,
                  t_atomtype type1,...)

{
  char in_AL;
  int iVar1;
  t_gotfn p_Var2;
  t_methodentry *ptVar3;
  _widgetbehavior *p_Var4;
  code *pcVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_170;
  int local_158 [12];
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  size_t local_a0;
  size_t l2;
  size_t l1;
  char *loadstring;
  _class *p_Stack_80;
  int typeflag;
  _class *c;
  int i;
  int count;
  t_atomtype *vp;
  t_atomtype vec [6];
  uint local_48;
  va_list ap;
  t_atomtype type1_local;
  int flags_local;
  size_t size_local;
  t_method freemethod_local;
  t_newmethod newmethod_local;
  t_symbol *s_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  _i = &vp;
  c._4_4_ = 0;
  loadstring._4_4_ = flags & 3;
  if (loadstring._4_4_ == 0) {
    loadstring._4_4_ = 3;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_48 = 0x30;
  do {
    vp._0_4_ = type1;
    if (*(int *)_i == 0) {
LAB_0019e078:
      if ((((pd_objectmaker != (t_pd)0x0) && (newmethod != (t_newmethod)0x0)) &&
          (class_addmethod(pd_objectmaker,(t_method)newmethod,s,(t_atomtype)vp,(ulong)vp._4_4_,
                           (ulong)vec[0],vec[1],vec[2],vec[3]), s != (t_symbol *)0x0)) &&
         ((class_loadsym != (t_symbol *)0x0 &&
          (p_Var2 = zgetfn(&pd_objectmaker,class_loadsym), p_Var2 == (t_gotfn)0x0)))) {
        l1 = (size_t)class_loadsym->s_name;
        l2 = strlen(s->s_name);
        local_a0 = strlen((char *)l1);
        if ((l2 < local_a0) &&
           (iVar1 = strcmp(s->s_name,(char *)(l1 + (local_a0 - l2))), iVar1 == 0)) {
          class_addmethod(pd_objectmaker,(t_method)newmethod,class_loadsym,(t_atomtype)vp,
                          (ulong)vp._4_4_,(ulong)vec[0],vec[1],vec[2],vec[3]);
        }
      }
      p_Stack_80 = (_class *)getbytes(0xa0);
      p_Stack_80->c_helpname = s;
      p_Stack_80->c_name = s;
      p_Stack_80->c_size = size;
      p_Stack_80->c_nmethod = 0;
      p_Stack_80->c_freemethod = freemethod;
      p_Stack_80->c_bangmethod = pd_defaultbang;
      p_Stack_80->c_pointermethod = pd_defaultpointer;
      p_Stack_80->c_floatmethod = pd_defaultfloat;
      p_Stack_80->c_symbolmethod = pd_defaultsymbol;
      p_Stack_80->c_listmethod = pd_defaultlist;
      p_Stack_80->c_anymethod = pd_defaultanything;
      p_Var4 = (_widgetbehavior *)0x0;
      if (loadstring._4_4_ == 3) {
        p_Var4 = &text_widgetbehavior;
      }
      p_Stack_80->c_wb = p_Var4;
      p_Stack_80->c_pwb = (_parentwidgetbehavior *)0x0;
      p_Stack_80->c_firstin = (flags & 8U) == 0;
      p_Stack_80->c_patchable = loadstring._4_4_ == 3;
      p_Stack_80->c_gobj = 1 < (int)loadstring._4_4_;
      p_Stack_80->c_drawcommand = '\0';
      p_Stack_80->c_floatsignalin = 0;
      p_Stack_80->c_externdir = class_extern_dir;
      pcVar5 = class_nosavefn;
      if (loadstring._4_4_ == 3) {
        pcVar5 = text_save;
      }
      p_Stack_80->c_savefn = pcVar5;
      p_Stack_80->c_classfreefn = (t_classfreefn)0x0;
      ptVar3 = (t_methodentry *)getbytes(0);
      p_Stack_80->c_methods = ptVar3;
      return p_Stack_80;
    }
    if (c._4_4_ == 5) {
      if (s == (t_symbol *)0x0) {
        pd_error((void *)0x0,"unnamed class: sorry: only %d args typechecked; use A_GIMME",5);
      }
      else {
        pd_error((void *)0x0,"class %s: sorry: only %d args typechecked; use A_GIMME",s->s_name,5);
      }
      goto LAB_0019e078;
    }
    _i = (t_atomtype **)((long)_i + 4);
    c._4_4_ = c._4_4_ + 1;
    if (local_48 < 0x29) {
      local_170 = (int *)((long)local_158 + (long)(int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_170 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    *(int *)_i = *local_170;
  } while( true );
}

Assistant:

t_class *class_new(t_symbol *s, t_newmethod newmethod, t_method freemethod,
    size_t size, int flags, t_atomtype type1, ...)
{
    va_list ap;
    t_atomtype vec[MAXPDARG+1], *vp = vec;
    int count = 0, i;
    t_class *c;
    int typeflag = flags & CLASS_TYPEMASK;
    if (!typeflag) typeflag = CLASS_PATCHABLE;
    *vp = type1;

    va_start(ap, type1);
    while (*vp)
    {
        if (count == MAXPDARG)
        {
            if (s)
                pd_error(0, "class %s: sorry: only %d args typechecked; use A_GIMME",
                      s->s_name, MAXPDARG);
            else
                pd_error(0, "unnamed class: sorry: only %d args typechecked; use A_GIMME",
                      MAXPDARG);
            break;
        }
        vp++;
        count++;
        *vp = va_arg(ap, t_atomtype);
    }
    va_end(ap);

    if (pd_objectmaker && newmethod)
    {
            /* add a "new" method by the name specified by the object */
        class_addmethod(pd_objectmaker, (t_method)newmethod, s,
            vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        if (s && class_loadsym && !zgetfn(&pd_objectmaker, class_loadsym))
        {
                /* if we're loading an extern it might have been invoked by a
                longer file name; in this case, make this an admissible name
                too. */
            const char *loadstring = class_loadsym->s_name;
            size_t l1 = strlen(s->s_name), l2 = strlen(loadstring);
            if (l2 > l1 && !strcmp(s->s_name, loadstring + (l2 - l1)))
                class_addmethod(pd_objectmaker, (t_method)newmethod,
                    class_loadsym,
                    vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        }
    }
    c = (t_class *)t_getbytes(sizeof(*c));
    c->c_name = c->c_helpname = s;
    c->c_size = size;
    c->c_nmethod = 0;
    c->c_freemethod = (t_method)freemethod;
    c->c_bangmethod = pd_defaultbang;
    c->c_pointermethod = pd_defaultpointer;
    c->c_floatmethod = pd_defaultfloat;
    c->c_symbolmethod = pd_defaultsymbol;
    c->c_listmethod = pd_defaultlist;
    c->c_anymethod = pd_defaultanything;
    c->c_wb = (typeflag == CLASS_PATCHABLE ? &text_widgetbehavior : 0);
    c->c_pwb = 0;
    c->c_firstin = ((flags & CLASS_NOINLET) == 0);
    c->c_patchable = (typeflag == CLASS_PATCHABLE);
    c->c_gobj = (typeflag >= CLASS_GOBJ);
    c->c_drawcommand = 0;
    c->c_floatsignalin = 0;
    c->c_externdir = class_extern_dir;
    c->c_savefn = (typeflag == CLASS_PATCHABLE ? text_save : class_nosavefn);
    c->c_classfreefn = 0;
#ifdef PDINSTANCE
    c->c_methods = (t_methodentry **)t_getbytes(
        pd_ninstances * sizeof(*c->c_methods));
    for (i = 0; i < pd_ninstances; i++)
        c->c_methods[i] = t_getbytes(0);
    c->c_next = class_list;
    class_list = c;
#else
    c->c_methods = t_getbytes(0);
#endif
#if 0       /* enable this if you want to see a list of all classes */
    post("class: %s", c->c_name->s_name);
#endif
    return (c);
}